

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O1

void aom_highbd_convolve8_vert_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,int bd)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ushort *puVar9;
  
  if (0 < w) {
    lVar6 = (long)src * 2 + src_stride * -6;
    lVar4 = (long)dst * 2;
    iVar2 = 0;
    do {
      if (0 < h) {
        uVar7 = 0;
        uVar8 = (uint)((ulong)filter_y >> 4) & 0xf;
        do {
          puVar9 = (ushort *)((long)((int)uVar8 >> 4) * src_stride * 2 + lVar6);
          lVar3 = 0;
          iVar5 = 0;
          do {
            iVar5 = iVar5 + (int)*(short *)((ulong)((uVar8 & 0xf) << 4) +
                                            ((ulong)filter_y & 0xffffffffffffff00) + lVar3 * 2) *
                            (uint)*puVar9;
            lVar3 = lVar3 + 1;
            puVar9 = puVar9 + src_stride;
          } while (lVar3 != 8);
          iVar5 = iVar5 + 0x40 >> 7;
          if (bd == 10) {
            iVar1 = 0x3ff;
          }
          else if (bd == 0xc) {
            iVar1 = 0xfff;
          }
          else {
            iVar1 = 0xff;
          }
          if (iVar1 <= iVar5) {
            iVar5 = iVar1;
          }
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          *(short *)(lVar4 + uVar7 * dst_stride * 2) = (short)iVar5;
          uVar8 = uVar8 + y_step_q4;
          uVar7 = uVar7 + 1;
        } while (uVar7 != (uint)h);
      }
      lVar6 = lVar6 + 2;
      lVar4 = lVar4 + 2;
      iVar2 = iVar2 + 1;
    } while (iVar2 != w);
  }
  return;
}

Assistant:

static void highbd_convolve_vert(const uint8_t *src8, ptrdiff_t src_stride,
                                 uint8_t *dst8, ptrdiff_t dst_stride,
                                 const InterpKernel *y_filters, int y0_q4,
                                 int y_step_q4, int w, int h, int bd) {
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  src -= src_stride * (SUBPEL_TAPS / 2 - 1);
  for (int x = 0; x < w; ++x) {
    int y_q4 = y0_q4;
    for (int y = 0; y < h; ++y) {
      const uint16_t *src_y = &src[(y_q4 >> SUBPEL_BITS) * src_stride];
      const int16_t *const y_filter = y_filters[y_q4 & SUBPEL_MASK];
      const int sum = highbd_vert_scalar_product(src_y, src_stride, y_filter);
      dst[y * dst_stride] =
          clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
      y_q4 += y_step_q4;
    }
    ++src;
    ++dst;
  }
}